

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-format.hh
# Opt level: O0

optional<int> * __thiscall
tinyusdz::crate::CrateValue::get_value<int>(optional<int> *__return_storage_ptr__,CrateValue *this)

{
  optional<int> local_20;
  CrateValue *local_18;
  CrateValue *this_local;
  
  local_18 = this;
  this_local = (CrateValue *)__return_storage_ptr__;
  tinyusdz::value::Value::get_value<int>(&local_20,&this->value_,false);
  nonstd::optional_lite::optional<int>::optional<int,_0>(__return_storage_ptr__,&local_20);
  nonstd::optional_lite::optional<int>::~optional(&local_20);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return value_.get_value<T>();
  }